

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O1

int attr_counter_inc(attr_counter **top,attr_counter *ac,attr_counter *last,mtree_entry_conflict *me
                    )

{
  int iVar1;
  int iVar2;
  attr_counter *paVar3;
  attr_counter *paVar4;
  int iVar5;
  bool bVar6;
  
  if (ac == (attr_counter *)0x0) {
    iVar5 = 0;
    if (last != (attr_counter *)0x0) {
      paVar3 = (attr_counter *)malloc(0x20);
      if (paVar3 == (attr_counter *)0x0) {
        iVar5 = -1;
      }
      else {
        paVar3->prev = last;
        paVar3->next = (attr_counter *)0x0;
        paVar3->count = 1;
        paVar3->m_entry = me;
        last->next = paVar3;
      }
    }
  }
  else {
    iVar1 = ac->count;
    ac->count = iVar1 + 1;
    iVar5 = 0;
    if ((*top != ac) && (paVar3 = ac->prev, iVar5 = 0, paVar3->count <= iVar1)) {
      bVar6 = paVar3 == (attr_counter *)0x0;
      paVar4 = paVar3;
      if (!bVar6) {
        iVar2 = paVar3->count;
        while (iVar2 <= iVar1) {
          paVar4 = paVar4->prev;
          bVar6 = paVar4 == (attr_counter *)0x0;
          if (bVar6) break;
          iVar2 = paVar4->count;
        }
      }
      paVar3->next = ac->next;
      if (ac->next != (attr_counter *)0x0) {
        ac->next->prev = paVar3;
      }
      if (bVar6) {
        ac->prev = (attr_counter *)0x0;
        ac->next = *top;
        *top = ac;
        paVar3 = ac->next;
      }
      else {
        ac->prev = paVar4;
        ac->next = paVar4->next;
        paVar4->next = ac;
        paVar3 = ac->next;
        if (paVar3 == (attr_counter *)0x0) {
          return 0;
        }
      }
      paVar3->prev = ac;
    }
  }
  return iVar5;
}

Assistant:

static int
attr_counter_inc(struct attr_counter **top, struct attr_counter *ac,
    struct attr_counter *last, struct mtree_entry *me)
{
	struct attr_counter *pac;

	if (ac != NULL) {
		ac->count++;
		if (*top == ac || ac->prev->count >= ac->count)
			return (0);
		for (pac = ac->prev; pac; pac = pac->prev) {
			if (pac->count >= ac->count)
				break;
		}
		ac->prev->next = ac->next;
		if (ac->next != NULL)
			ac->next->prev = ac->prev;
		if (pac != NULL) {
			ac->prev = pac;
			ac->next = pac->next;
			pac->next = ac;
			if (ac->next != NULL)
				ac->next->prev = ac;
		} else {
			ac->prev = NULL;
			ac->next = *top;
			*top = ac;
			ac->next->prev = ac;
		}
	} else if (last != NULL) {
		ac = attr_counter_new(me, last);
		if (ac == NULL)
			return (-1);
		last->next = ac;
	}
	return (0);
}